

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

void duckdb::ParquetScanFunction::VerifyParquetSchemaParameter(Value *schema)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  LogicalType *pLVar4;
  LogicalType *type;
  child_list_t<LogicalType> *this;
  const_reference pvVar5;
  InvalidInputException *pIVar6;
  LogicalTypeId type_00;
  LogicalTypeId type_01;
  LogicalTypeId type_02;
  LogicalTypeId type_03;
  long lVar7;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l;
  allocator_type local_1b1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_1b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_178 [56];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_140 [32];
  LogicalType local_120;
  child_list_t<LogicalType> local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  LogicalType local_40;
  
  LogicalType::LogicalType(&local_d8,BLOB);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[5],_const_duckdb::LogicalTypeId_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&local_1b0,(char (*) [5])0x1dd9b3c,&LogicalType::VARCHAR);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[5],_const_duckdb::LogicalTypeId_&,_true>
            (local_178,(char (*) [5])0x1dc741f,&LogicalType::VARCHAR);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[14],_const_duckdb::LogicalTypeId_&,_true>
            (local_140,(char (*) [14])0x1f1eb90,&LogicalType::VARCHAR);
  __l._M_len = 3;
  __l._M_array = &local_1b0;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_108,__l,&local_1b1);
  LogicalType::STRUCT(&local_f0,&local_108);
  LogicalType::MAP(&local_40,&local_d8,&local_f0);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType(&local_f0);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_108);
  lVar7 = -0xa8;
  pLVar4 = &local_120;
  do {
    LogicalType::~LogicalType(pLVar4);
    p_Var2 = pLVar4[-2].type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pLVar4[-1].type_info_ != p_Var2) {
      operator_delete(p_Var2);
    }
    pLVar4 = (LogicalType *)
             &pLVar4[-3].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0);
  LogicalType::~LogicalType(&local_d8);
  if ((schema->type_).id_ != MAP) {
    pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_1b0.first._M_dataplus._M_p = (pointer)&local_1b0.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"\'schema\' expects a value of type MAP, not %s","");
    LogicalTypeIdToString_abi_cxx11_(&local_60,(duckdb *)(ulong)(schema->type_).id_,type_00);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar6,&local_1b0.first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
    __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pLVar4 = MapType::KeyType(&schema->type_);
  type = MapType::ValueType(&schema->type_);
  if (type->id_ != STRUCT) {
    pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_1b0.first._M_dataplus._M_p = (pointer)&local_1b0.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"\'schema\' expects a STRUCT as the value type of the map","");
    InvalidInputException::InvalidInputException(pIVar6,(string *)&local_1b0);
    __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this = StructType::GetChildTypes_abi_cxx11_(type);
  if (2 < (ulong)(((long)(this->
                         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         ).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->
                         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         ).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7)) {
    pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::operator[](this,0);
    paVar1 = &local_1b0.first.field_2;
    local_1b0.first._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"name","");
    bVar3 = StringUtil::CIEquals((string *)pvVar5,(string *)&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0.first._M_dataplus._M_p);
    }
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_1b0.first._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,
                 "\'schema\' expects the first field of the struct to be called \'name\'","");
      InvalidInputException::InvalidInputException(pIVar6,(string *)&local_1b0);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::operator[](this,0);
    if ((pvVar5->second).id_ != VARCHAR) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_1b0.first._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,
                 "\'schema\' expects the \'name\' field to be of type VARCHAR, not %s","");
      pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[](this,0);
      LogicalTypeIdToString_abi_cxx11_(&local_80,(duckdb *)(ulong)(pvVar5->second).id_,type_01);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar6,&local_1b0.first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::operator[](this,1);
    local_1b0.first._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"type","");
    bVar3 = StringUtil::CIEquals((string *)pvVar5,(string *)&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0.first._M_dataplus._M_p);
    }
    if (bVar3) {
      pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[](this,1);
      if ((pvVar5->second).id_ != VARCHAR) {
        pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_1b0.first._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,
                   "\'schema\' expects the \'type\' field to be of type VARCHAR, not %s","");
        pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 ::operator[](this,1);
        LogicalTypeIdToString_abi_cxx11_(&local_a0,(duckdb *)(ulong)(pvVar5->second).id_,type_02);
        InvalidInputException::InvalidInputException<std::__cxx11::string>
                  (pIVar6,&local_1b0.first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
        __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[](this,2);
      local_1b0.first._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"default_value","");
      bVar3 = StringUtil::CIEquals((string *)pvVar5,(string *)&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b0.first._M_dataplus._M_p);
      }
      if (bVar3) {
        if ((pLVar4->id_ != INTEGER) && (pLVar4->id_ != VARCHAR)) {
          pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_1b0.first._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,
                     "\'schema\' expects the value type of the map to be either INTEGER or VARCHAR, not %s"
                     ,"");
          LogicalTypeIdToString_abi_cxx11_(&local_c0,(duckdb *)(ulong)pLVar4->id_,type_03);
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    (pIVar6,&local_1b0.first,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0)
          ;
          __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        return;
      }
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_1b0.first._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,
                 "\'schema\' expects the third field of the struct to be called \'default_value\'",
                 "");
      InvalidInputException::InvalidInputException(pIVar6,(string *)&local_1b0);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_1b0.first._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,
               "\'schema\' expects the second field of the struct to be called \'type\'","");
    InvalidInputException::InvalidInputException(pIVar6,(string *)&local_1b0);
    __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_1b0.first._M_dataplus._M_p = (pointer)&local_1b0.first.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,
             "\'schema\' expects the STRUCT to have 3 children, \'name\', \'type\' and \'default_value"
             ,"");
  InvalidInputException::InvalidInputException(pIVar6,(string *)&local_1b0);
  __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void VerifyParquetSchemaParameter(const Value &schema) {
		LogicalType::MAP(LogicalType::BLOB, LogicalType::STRUCT({{{"name", LogicalType::VARCHAR},
		                                                          {"type", LogicalType::VARCHAR},
		                                                          {"default_value", LogicalType::VARCHAR}}}));
		auto &map_type = schema.type();
		if (map_type.id() != LogicalTypeId::MAP) {
			throw InvalidInputException("'schema' expects a value of type MAP, not %s",
			                            LogicalTypeIdToString(map_type.id()));
		}
		auto &key_type = MapType::KeyType(map_type);
		auto &value_type = MapType::ValueType(map_type);

		if (value_type.id() != LogicalTypeId::STRUCT) {
			throw InvalidInputException("'schema' expects a STRUCT as the value type of the map");
		}
		auto &children = StructType::GetChildTypes(value_type);
		if (children.size() < 3) {
			throw InvalidInputException(
			    "'schema' expects the STRUCT to have 3 children, 'name', 'type' and 'default_value");
		}
		if (!StringUtil::CIEquals(children[0].first, "name")) {
			throw InvalidInputException("'schema' expects the first field of the struct to be called 'name'");
		}
		if (children[0].second.id() != LogicalTypeId::VARCHAR) {
			throw InvalidInputException("'schema' expects the 'name' field to be of type VARCHAR, not %s",
			                            LogicalTypeIdToString(children[0].second.id()));
		}
		if (!StringUtil::CIEquals(children[1].first, "type")) {
			throw InvalidInputException("'schema' expects the second field of the struct to be called 'type'");
		}
		if (children[1].second.id() != LogicalTypeId::VARCHAR) {
			throw InvalidInputException("'schema' expects the 'type' field to be of type VARCHAR, not %s",
			                            LogicalTypeIdToString(children[1].second.id()));
		}
		if (!StringUtil::CIEquals(children[2].first, "default_value")) {
			throw InvalidInputException("'schema' expects the third field of the struct to be called 'default_value'");
		}
		//! NOTE: default_value can be any type

		if (key_type.id() != LogicalTypeId::INTEGER && key_type.id() != LogicalTypeId::VARCHAR) {
			throw InvalidInputException(
			    "'schema' expects the value type of the map to be either INTEGER or VARCHAR, not %s",
			    LogicalTypeIdToString(key_type.id()));
		}
	}